

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_range(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  int iVar1;
  char *pcVar2;
  char local_68 [8];
  char buffer [32];
  char *orig;
  curl_off_t value;
  char *pcStack_28;
  ParameterError err;
  char *nextarg_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  value._4_4_ = PARAM_OK;
  pcStack_28 = nextarg;
  nextarg_local = (char *)config;
  config_local = (OperationConfig *)global;
  if ((*(ulong *)&config->field_0x4e4 >> 4 & 1) == 0) {
    iVar1 = Curl_str_number(&stack0xffffffffffffffd8,(curl_off_t *)&orig,0x7fffffffffffffff);
    if ((iVar1 == 0) && (iVar1 = Curl_str_single(&stack0xffffffffffffffd8,'-'), iVar1 != 0)) {
      warnf((GlobalConfig *)config_local,
            "A specified range MUST include at least one dash (-). Appending one for you");
      curl_msnprintf(local_68,0x20,"%ld-",orig);
      free(*(void **)(nextarg_local + 0x100));
      pcVar2 = strdup(local_68);
      *(char **)(nextarg_local + 0x100) = pcVar2;
      if (*(long *)(nextarg_local + 0x100) == 0) {
        value._4_4_ = PARAM_NO_MEM;
      }
    }
    else {
      for (; *pcStack_28 != '\0'; pcStack_28 = pcStack_28 + 1) {
        if ((((*pcStack_28 < '0') || ('9' < *pcStack_28)) && (*pcStack_28 != '-')) &&
           (*pcStack_28 != ',')) {
          warnf((GlobalConfig *)config_local,
                "Invalid character is found in given range. A specified range MUST have only digits in \'start\'-\'stop\'. The server\'s response to this request is uncertain."
               );
          break;
        }
      }
      value._4_4_ = getstr((char **)(nextarg_local + 0x100),nextarg,false);
    }
    global_local._4_4_ = value._4_4_;
  }
  else {
    errorf(global,"--continue-at is mutually exclusive with --range");
    global_local._4_4_ = PARAM_BAD_USE;
  }
  return global_local._4_4_;
}

Assistant:

static ParameterError parse_range(struct GlobalConfig *global,
                                  struct OperationConfig *config,
                                  const char *nextarg)
{
  ParameterError err = PARAM_OK;
  curl_off_t value;
  const char *orig = nextarg;

  if(config->use_resume) {
    errorf(global, "--continue-at is mutually exclusive with --range");
    return PARAM_BAD_USE;
  }
  if(!curlx_str_number(&nextarg, &value, CURL_OFF_T_MAX) &&
     curlx_str_single(&nextarg, '-')) {
    /* Specifying a range WITHOUT A DASH will create an illegal HTTP range
       (and will not actually be range by definition). The manpage previously
       claimed that to be a good way, why this code is added to work-around
       it. */
    char buffer[32];
    warnf(global, "A specified range MUST include at least one dash (-). "
          "Appending one for you");
    msnprintf(buffer, sizeof(buffer), "%" CURL_FORMAT_CURL_OFF_T "-",
              value);
    free(config->range);
    config->range = strdup(buffer);
    if(!config->range)
      err = PARAM_NO_MEM;
  }
  else {
    /* byte range requested */
    while(*nextarg) {
      if(!ISDIGIT(*nextarg) && *nextarg != '-' && *nextarg != ',') {
        warnf(global, "Invalid character is found in given range. "
              "A specified range MUST have only digits in "
              "\'start\'-\'stop\'. The server's response to this "
              "request is uncertain.");
        break;
      }
      nextarg++;
    }
    err = getstr(&config->range, orig, DENY_BLANK);
  }
  return err;
}